

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,unsigned_long,fmt::v8::detail::digit_grouping<char32_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long significand,
          int significand_size,int integral_size,char32_t decimal_point,
          digit_grouping<char32_t> *grouping)

{
  char32_t cVar1;
  type tVar2;
  char32_t *pcVar3;
  char32_t *end;
  basic_string_view<char32_t> local_878;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> local_868;
  buffer<char32_t> *local_860;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> local_858 [3];
  allocator<char32_t> local_839;
  undefined1 local_838 [8];
  basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> buffer;
  digit_grouping<char32_t> *grouping_local;
  char32_t decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  unsigned_long significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_local;
  
  cVar1 = digit_grouping<char32_t>::separator(grouping);
  if (cVar1 == L'\0') {
    buffer._2032_8_ = out.container;
    out_local = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned_long,_char32_t,_0>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  else {
    std::allocator<char32_t>::allocator(&local_839);
    basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_>::basic_memory_buffer
              ((basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> *)local_838,
               &local_839);
    std::allocator<char32_t>::~allocator(&local_839);
    std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>::back_insert_iterator
              (local_858,(buffer<char32_t> *)local_838);
    local_860 = (buffer<char32_t> *)
                write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned_long,_char32_t,_0>
                          (local_858[0],significand,significand_size,integral_size,decimal_point);
    local_868.container = out.container;
    pcVar3 = buffer<char32_t>::data((buffer<char32_t> *)local_838);
    tVar2 = to_unsigned<int>(integral_size);
    basic_string_view<char32_t>::basic_string_view(&local_878,pcVar3,(ulong)tVar2);
    digit_grouping<char32_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
              (grouping,local_868,local_878);
    pcVar3 = buffer<char32_t>::data((buffer<char32_t> *)local_838);
    end = buffer<char32_t>::end((buffer<char32_t> *)local_838);
    out_local = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                          (pcVar3 + integral_size,end,out);
    basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_>::~basic_memory_buffer
              ((basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> *)local_838);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}